

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O1

btree_result
btree_init_and_load(btree *btree,void *blk_handle,btree_blk_ops *blk_ops,btree_kv_ops *kv_ops,
                   uint32_t nodesize,uint8_t ksize,uint8_t vsize,bnode_flag_t flag,btree_meta *meta,
                   uint64_t num_keys,btree_load_get_next_kv *next_kv,
                   btree_load_write_done *write_done,void *aux)

{
  ushort uVar1;
  ushort uVar2;
  idx_t iVar3;
  _func_voidref_void_ptr_bid_t_ptr *p_Var4;
  ulong uVar5;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var6;
  bid_t bVar7;
  bnode *pbVar8;
  void *pvVar9;
  ushort uVar10;
  ulong uVar11;
  ushort *puVar12;
  ushort *puVar13;
  btree_kv_ops *pbVar14;
  bnode *pbVar15;
  size_t sVar16;
  ulong uVar17;
  void **ppvVar18;
  void *pvVar19;
  btree_result bVar20;
  void *pvVar21;
  void *node_addr_1;
  long lVar22;
  size_t sVar23;
  size_t __n;
  bnode *node;
  long local_70;
  uint64_t local_68;
  void *local_60;
  ulong local_58;
  void *local_50;
  ulong local_48;
  void **local_40;
  void *val_to_insert;
  void *key_to_insert;
  
  btree->root_flag = flag | 1;
  btree->blk_ops = blk_ops;
  btree->blk_handle = blk_handle;
  btree->kv_ops = kv_ops;
  btree->height = 1;
  btree->blksize = nodesize;
  btree->ksize = ksize;
  btree->vsize = vsize;
  if (meta == (btree_meta *)0x0) {
    lVar22 = 0x11;
  }
  else {
    btree->root_flag = flag | 3;
    lVar22 = (ulong)(meta->size + 0x11 & 0xfffffff0) + 0x11;
  }
  bVar20 = BTREE_RESULT_FAIL;
  if ((uint)lVar22 <= nodesize) {
    uVar17 = (ulong)vsize + (ulong)ksize;
    local_58 = ((ulong)nodesize - 0x11) / uVar17;
    uVar11 = local_58;
    if (meta != (btree_meta *)0x0) {
      uVar11 = (((ulong)nodesize - (ulong)(meta->size + 0x11 & 0xfffffff0)) - 0x11) / uVar17;
    }
    if (uVar11 < num_keys) {
      local_48 = 1;
      __n = 8;
      do {
        sVar23 = __n;
        uVar11 = uVar11 * local_58;
        local_48 = local_48 + 1;
        __n = sVar23 + 8;
      } while (uVar11 < num_keys);
      uVar11 = sVar23 + 0x17 & 0xfffffffffffffff0;
      lVar22 = -uVar11;
      pvVar21 = (void *)(((long)&local_68 + lVar22) - uVar11);
      *(undefined8 *)((long)pvVar21 + -8) = 0x10ef5d;
      memset((void *)((long)&local_68 + lVar22),0,__n);
      local_50 = pvVar21;
      *(undefined8 *)((long)pvVar21 + -8) = 0x10ef6e;
      memset(pvVar21,0,__n);
      pvVar21 = (void *)((long)pvVar21 - (ulong)(ksize + 0xf & 0xfffffff0));
      local_60 = pvVar21;
      local_68 = 0;
      do {
        if (local_48 != 0) {
          uVar17 = 1;
          uVar11 = local_48;
          do {
            if (*(long *)((long)&local_70 + uVar17 * 8 + lVar22) == 0) {
              val_to_insert = (void *)0x0;
              pvVar19 = btree->blk_handle;
              p_Var4 = btree->blk_ops->blk_alloc;
              *(undefined8 *)((long)pvVar21 + -8) = 0x10efc4;
              puVar12 = (ushort *)(*p_Var4)(pvVar19,(bid_t *)&val_to_insert);
              if (uVar17 < local_48) {
                uVar1._0_1_ = btree->ksize;
                uVar1._1_1_ = btree->vsize;
                *puVar12 = uVar1 << 8 | uVar1 >> 8;
                puVar12[3] = 0;
                puVar12[2] = (ushort)uVar17;
                puVar12[1] = 0;
                *(ushort **)(puVar12 + 4) = puVar12 + 8;
                *(ushort **)((long)&local_70 + uVar17 * 8 + lVar22) = puVar12;
              }
              else {
                uVar10._0_1_ = btree->ksize;
                uVar10._1_1_ = btree->vsize;
                uVar2 = btree->root_flag;
                *puVar12 = uVar10 << 8 | uVar10 >> 8;
                puVar12[3] = 0;
                puVar12[2] = (ushort)uVar17;
                puVar12[1] = uVar2;
                puVar13 = puVar12;
                if ((uVar2 & 2) != 0 && meta != (btree_meta *)0x0) {
                  puVar12[8] = meta->size << 8 | meta->size >> 8;
                  pvVar19 = meta->data;
                  uVar10 = meta->size;
                  *(undefined8 *)((long)pvVar21 + -8) = 0x10f051;
                  memcpy(puVar12 + 9,pvVar19,(ulong)uVar10);
                  puVar13 = (ushort *)((ulong)(meta->size + 0x11 & 0xfffffff0) + (long)puVar12);
                }
                *(ushort **)(puVar12 + 4) = puVar13 + 8;
                *(ushort **)((long)&local_70 + uVar17 * 8 + lVar22) = puVar12;
                btree->root_bid = (bid_t)val_to_insert;
              }
              *(void **)((long)local_50 + uVar17 * 8 + -8) = val_to_insert;
            }
            if (uVar17 == 1) {
              val_to_insert = (void *)0x0;
              local_40 = (void **)0x0;
              *(undefined8 *)((long)pvVar21 + -8) = 0x10f0ae;
              (*next_kv)(&val_to_insert,&local_40,aux);
              pbVar14 = btree->kv_ops;
              pbVar15 = *(bnode **)((long)&local_68 + lVar22);
              iVar3 = pbVar15->nentry;
              ppvVar18 = local_40;
              pvVar19 = val_to_insert;
            }
            else {
              uVar5 = *(ulong *)((long)local_50 + uVar17 * 8 + -0x10);
              val_to_insert =
                   (void *)(uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                            (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                            (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
                            (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38);
              pbVar14 = btree->kv_ops;
              pbVar15 = *(bnode **)((long)&local_70 + uVar17 * 8 + lVar22);
              iVar3 = pbVar15->nentry;
              ppvVar18 = &val_to_insert;
              pvVar19 = local_60;
            }
            p_Var6 = pbVar14->set_kv;
            *(undefined8 *)((long)pvVar21 + -8) = 0x10f0ed;
            (*p_Var6)(pbVar15,iVar3,pvVar19,ppvVar18);
            pvVar9 = local_50;
            pvVar19 = local_60;
            pbVar15 = *(bnode **)((long)&local_70 + uVar17 * 8 + lVar22);
            iVar3 = pbVar15->nentry;
            uVar10 = iVar3 + 1;
            pbVar15->nentry = uVar10;
            if (iVar3 != 0) {
              if (local_58 <= uVar10) {
                pvVar19 = btree->blk_handle;
                bVar7 = *(bid_t *)((long)local_50 + uVar17 * 8 + -8);
                *(undefined8 *)((long)pvVar21 + -8) = 0x10f13b;
                (*write_done)(pvVar19,bVar7,aux);
                *(undefined8 *)((long)&local_70 + uVar17 * 8 + lVar22) = 0;
                *(undefined8 *)((long)pvVar9 + uVar17 * 8 + -8) = 0;
              }
              break;
            }
            p_Var6 = btree->kv_ops->get_kv;
            *(undefined8 *)((long)pvVar21 + -8) = 0x10f111;
            (*p_Var6)(pbVar15,0,pvVar19,(void *)0x0);
            uVar17 = uVar17 + 1;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
        local_68 = local_68 + 1;
      } while (local_68 != num_keys);
    }
    else {
      if ((blk_ops->blk_alloc_sub == (_func_voidref_void_ptr_bid_t_ptr *)0x0) ||
         (blk_ops->blk_enlarge_node == (_func_voidref_void_ptr_bid_t_size_t_bid_t_ptr *)0x0)) {
        local_70 = 0x10f1c5;
        pbVar15 = (bnode *)(*blk_ops->blk_alloc)(blk_handle,&btree->root_bid);
      }
      else {
        uVar11 = lVar22 + uVar17 * num_keys;
        local_70 = 0x10f183;
        pbVar15 = (bnode *)(*blk_ops->blk_alloc_sub)(blk_handle,&btree->root_bid);
        local_70 = 0x10f195;
        sVar16 = (*btree->blk_ops->blk_get_size)(btree->blk_handle,btree->root_bid);
        if (sVar16 < uVar11) {
          local_70 = 0x10f1af;
          pbVar15 = (bnode *)(*btree->blk_ops->blk_enlarge_node)
                                       (btree->blk_handle,btree->root_bid,uVar11,&btree->root_bid);
        }
      }
      uVar10 = btree->root_flag;
      uVar2._0_1_ = btree->ksize;
      uVar2._1_1_ = btree->vsize;
      pbVar15->kvsize = uVar2 << 8 | uVar2 >> 8;
      pbVar15->level = 1;
      pbVar15->nentry = 0;
      pbVar15->flag = uVar10;
      pbVar8 = pbVar15;
      if (meta != (btree_meta *)0x0 && (uVar10 & 2) != 0) {
        pbVar15[1].kvsize = meta->size << 8 | meta->size >> 8;
        local_70 = 0x10f214;
        memcpy(&pbVar15[1].flag,meta->data,(ulong)meta->size);
        pbVar8 = (bnode *)((long)&pbVar15->kvsize + (ulong)(meta->size + 0x11 & 0xfffffff0));
      }
      (pbVar15->field_4).data = pbVar8 + 1;
      if (num_keys != 0) {
        do {
          val_to_insert = (void *)0x0;
          local_40 = (void **)0x0;
          local_70 = 0x10f253;
          (*next_kv)(&val_to_insert,&local_40,aux);
          local_70 = 0x10f26a;
          (*btree->kv_ops->set_kv)(pbVar15,pbVar15->nentry,val_to_insert,local_40);
          pbVar15->nentry = pbVar15->nentry + 1;
          num_keys = num_keys - 1;
        } while (num_keys != 0);
        return BTREE_RESULT_SUCCESS;
      }
    }
    bVar20 = BTREE_RESULT_SUCCESS;
  }
  return bVar20;
}

Assistant:

btree_result btree_init_and_load(
        struct btree *btree,
        void *blk_handle,
        struct btree_blk_ops *blk_ops,
        struct btree_kv_ops *kv_ops,
        uint32_t nodesize,
        uint8_t ksize,
        uint8_t vsize,
        bnode_flag_t flag,
        struct btree_meta *meta,
        uint64_t num_keys,
        btree_load_get_next_kv* next_kv,
        btree_load_write_done* write_done,
        void* aux)
{
    void *addr;
    size_t min_nodesize = 0;

    btree->root_flag = BNODE_MASK_ROOT | flag;
    btree->blk_ops = blk_ops;
    btree->blk_handle = blk_handle;
    btree->kv_ops = kv_ops;
    btree->height = 1;
    btree->blksize = nodesize;
    btree->ksize = ksize;
    btree->vsize = vsize;
    if (meta) {
        btree->root_flag |= BNODE_MASK_METADATA;
        min_nodesize = sizeof(struct bnode) + _metasize_align(meta->size) +
                       sizeof(metasize_t) + BLK_MARKER_SIZE;
    } else {
        min_nodesize = sizeof(struct bnode) + BLK_MARKER_SIZE;
    }

    if (min_nodesize > btree->blksize) {
        // too large metadata .. init fail
        return BTREE_RESULT_FAIL;
    }

    // Calculate max # key-values per node.
    size_t max_num_entries_non_root =
        (nodesize - sizeof(struct bnode) - BLK_MARKER_SIZE) / (ksize + vsize);
    size_t max_num_entries_root =
        meta
        ? ( nodesize - sizeof(struct bnode) - _metasize_align(meta->size) -
            sizeof(metasize_t) - BLK_MARKER_SIZE ) / (ksize + vsize)
        : max_num_entries_non_root;

    if (num_keys <= max_num_entries_root) {
        // Single height tree.
        size_t required_size = min_nodesize + num_keys * (ksize + vsize);
        if (btree->blk_ops->blk_alloc_sub && btree->blk_ops->blk_enlarge_node) {
            addr = btree->blk_ops->blk_alloc_sub(btree->blk_handle, &btree->root_bid);

            size_t subblock_size =
                btree->blk_ops->blk_get_size(btree->blk_handle,
                                             btree->root_bid);
            if (subblock_size < required_size) {
                addr = btree->blk_ops->blk_enlarge_node(btree->blk_handle,
                                                        btree->root_bid,
                                                        required_size,
                                                        &btree->root_bid);
            }
        } else {
            addr = btree->blk_ops->blk_alloc(btree->blk_handle, &btree->root_bid);
        }
        struct bnode* root_node =
            _btree_init_node( btree, btree->root_bid, addr,
                              btree->root_flag, 1, meta );

        // Put entries.
        for (uint64_t ii = 0; ii < num_keys; ++ii) {
            void* key_to_insert = nullptr;
            void* val_to_insert = nullptr;
            next_kv(&key_to_insert, &val_to_insert, aux);
            btree->kv_ops->set_kv( root_node, root_node->nentry,
                                   key_to_insert, val_to_insert );
            root_node->nentry++;
        }
        return BTREE_RESULT_SUCCESS;

    }

    // Otherwise: height >= 2, calculate the tree height.
    size_t exp_height = 2;
    uint64_t max_accomm_entries = max_num_entries_root * max_num_entries_non_root;
    while (max_accomm_entries < num_keys) {
        exp_height++;
        max_accomm_entries *= max_num_entries_non_root;
    }

    struct bnode** cur_node = alca(struct bnode*, exp_height);
    bid_t* node_bids = alca(bid_t, exp_height);
    memset(cur_node, 0x0, sizeof(struct bnode*) * exp_height);
    memset(node_bids, 0x0, sizeof(bid_t) * exp_height);

    uint8_t *k_in_child = alca(uint8_t, btree->ksize);

    for (uint64_t ii = 0; ii < num_keys; ++ii) {
        for (size_t jj = 0; jj < exp_height; ++jj) {
            if (!cur_node[jj]) {
                bid_t new_bid = 0;
                void* new_addr = btree->blk_ops->blk_alloc( btree->blk_handle,
                                                            &new_bid );
                if (jj + 1 < exp_height) {
                    cur_node[jj] = _btree_init_node( btree, new_bid, new_addr,
                                                     0x0, jj + 1, NULL );
                } else {
                    // Root node, should set the flags.
                    cur_node[jj] = _btree_init_node( btree, new_bid, new_addr,
                                                     btree->root_flag, jj + 1,
                                                     meta );
                    btree->root_bid = new_bid;
                }
                node_bids[jj] = new_bid;
            }

            if (jj == 0) {
                // Leaf node: {key, value}
                void* key_to_insert = nullptr;
                void* val_to_insert = nullptr;
                next_kv(&key_to_insert, &val_to_insert, aux);
                btree->kv_ops->set_kv( cur_node[jj], cur_node[jj]->nentry,
                                       key_to_insert, val_to_insert );
            } else {
                // Non-leaf node: {key, BID of child}
                bid_t enc_bid = _endian_encode(node_bids[jj - 1]);
                btree->kv_ops->set_kv( cur_node[jj], cur_node[jj]->nentry,
                                       k_in_child, &enc_bid );
            }

            cur_node[jj]->nentry++;
            if (cur_node[jj]->nentry == 1) {
                // Need to put the first entry to the parent node.
                btree->kv_ops->get_kv(cur_node[jj], 0, k_in_child, NULL);
            } else {
                if (cur_node[jj]->nentry >= max_num_entries_non_root) {
                    // Otherwise: full, should allocate a new one.
                    write_done(btree->blk_handle, node_bids[jj], aux);
                    cur_node[jj] = NULL;
                    node_bids[jj] = 0;
                }
                break;
            }
        }
    }

    return BTREE_RESULT_SUCCESS;
}